

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

void __thiscall
TCLAP::Arg::Arg(Arg *this,string *flag,string *name,string *desc,bool req,bool valreq,Visitor *v)

{
  string *psVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  SpecificationException *pSVar8;
  long *plVar9;
  size_type *psVar10;
  long *plVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  string local_1f0;
  string *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  string *local_180;
  string *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  string *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined1 local_3e;
  
  this->_vptr_Arg = (_func_int **)&PTR__Arg_00150178;
  psVar1 = &this->_flag;
  local_160 = &(this->_flag).field_2;
  (this->_flag)._M_dataplus._M_p = (pointer)local_160;
  pcVar4 = (flag->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)psVar1,pcVar4,pcVar4 + flag->_M_string_length)
  ;
  local_1d0 = &this->_name;
  local_168 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)local_168;
  pcVar4 = (name->_M_dataplus)._M_p;
  local_158 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,pcVar4,pcVar4 + name->_M_string_length);
  local_170 = &(this->_description).field_2;
  (this->_description)._M_dataplus._M_p = (pointer)local_170;
  pcVar4 = (desc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_description,pcVar4,pcVar4 + desc->_M_string_length);
  this->_required = req;
  psVar2 = &this->_requireLabel;
  paVar3 = &(this->_requireLabel).field_2;
  (this->_requireLabel)._M_dataplus._M_p = (pointer)paVar3;
  local_178 = &this->_description;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"required","");
  this->_valueRequired = valreq;
  this->_alreadySet = false;
  this->_visitor = v;
  this->_ignoreable = true;
  this->_xorSet = false;
  this->_acceptsMultipleValues = false;
  uVar5 = (this->_flag)._M_string_length;
  local_188 = paVar3;
  local_180 = psVar2;
  if (1 < uVar5) {
    pSVar8 = (SpecificationException *)__cxa_allocate_exception(0x68);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"Argument flag can only be one character long","");
    (*this->_vptr_Arg[7])(&local_d0,this);
    SpecificationException::SpecificationException(pSVar8,&local_1f0,&local_d0);
    __cxa_throw(pSVar8,&SpecificationException::typeinfo,ArgException::~ArgException);
  }
  paVar3 = &local_1f0.field_2;
  local_1f0.field_2._M_allocated_capacity._0_4_ = 0x6f6e6769;
  local_1f0.field_2._M_allocated_capacity._4_4_ = 0x725f6572;
  local_1f0._M_string_length = 0xb;
  local_1f0.field_2._8_4_ = 0x747365;
  bVar12 = true;
  local_1f0._M_dataplus._M_p = (pointer)paVar3;
  if ((this->_name)._M_string_length == 0xb) {
    iVar6 = bcmp((local_1d0->_M_dataplus)._M_p,paVar3,0xb);
    bVar12 = iVar6 != 0;
  }
  if (bVar12) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0.field_2._M_allocated_capacity._0_2_ = 0x2d;
    local_d0._M_string_length = 1;
    if (uVar5 == 1) {
      iVar6 = bcmp((psVar1->_M_dataplus)._M_p,local_d0._M_dataplus._M_p,1);
      if (iVar6 == 0) {
        bVar13 = true;
        bVar14 = false;
        goto LAB_0012369e;
      }
    }
    local_50 = &local_40;
    local_40 = 0x2d2d;
    local_48 = 2;
    local_3e = 0;
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    bVar13 = iVar6 == 0;
    bVar14 = true;
  }
  else {
    bVar14 = false;
    bVar13 = false;
  }
LAB_0012369e:
  if ((bVar14) && (local_50 != &local_40)) {
    operator_delete(local_50);
  }
  if ((bVar12) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (bVar13) {
    pSVar8 = (SpecificationException *)__cxa_allocate_exception(0x68);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0.field_2._M_allocated_capacity._0_2_ = 0x2d;
    local_f0._M_string_length = 1;
    std::operator+(&local_150,"Argument flag cannot be either \'",&local_f0);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_1c8._M_dataplus._M_p = (pointer)*plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_1c8._M_dataplus._M_p == psVar10) {
      local_1c8.field_2._M_allocated_capacity = *psVar10;
      local_1c8.field_2._8_8_ = plVar9[3];
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar10;
    }
    local_1c8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
    local_110._M_string_length = 2;
    local_110.field_2._M_local_buf[2] = '\0';
    std::operator+(&local_1a8,&local_1c8,&local_110);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_1f0._M_dataplus._M_p = (pointer)*plVar9;
    plVar11 = plVar9 + 2;
    if ((long *)local_1f0._M_dataplus._M_p == plVar11) {
      local_1f0.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar11;
      local_1f0.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar9 + 0x14);
      local_1f0.field_2._8_4_ = (undefined4)plVar9[3];
      local_1f0.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
      local_1f0._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_1f0.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar11;
      local_1f0.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar11 >> 0x20);
    }
    local_1f0._M_string_length = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    (*this->_vptr_Arg[7])(&local_130,this);
    SpecificationException::SpecificationException(pSVar8,&local_1f0,&local_130);
    __cxa_throw(pSVar8,&SpecificationException::typeinfo,ArgException::~ArgException);
  }
  local_1a8.field_2._M_allocated_capacity._0_2_ = 0x2d;
  local_1a8._M_string_length = 1;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::substr((ulong)&local_1f0,(ulong)local_1d0);
  paVar3 = &local_1c8.field_2;
  local_1c8.field_2._M_allocated_capacity._0_2_ = 0x2d;
  local_1c8._M_string_length = 1;
  local_1c8._M_dataplus._M_p = (pointer)paVar3;
  if (local_1f0._M_string_length == 1) {
    iVar6 = bcmp(local_1f0._M_dataplus._M_p,paVar3,1);
    bVar12 = iVar6 == 0;
  }
  else {
    bVar12 = false;
  }
  bVar14 = true;
  if (!bVar12) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
    local_f0._M_string_length = 2;
    local_f0.field_2._M_local_buf[2] = '\0';
    std::__cxx11::string::substr((ulong)&local_150,(ulong)local_1d0);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
    local_110._M_string_length = 2;
    local_110.field_2._M_local_buf[2] = '\0';
    if (local_150._M_string_length == 2) {
      iVar6 = bcmp(local_150._M_dataplus._M_p,local_110._M_dataplus._M_p,2);
      if (iVar6 == 0) goto LAB_001237f9;
    }
    lVar7 = std::__cxx11::string::find((char *)local_1d0,0x140634,0);
    bVar14 = lVar7 != -1;
  }
LAB_001237f9:
  if (!bVar12) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if (!bVar14) {
    return;
  }
  pSVar8 = (SpecificationException *)__cxa_allocate_exception(0x68);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70.field_2._M_allocated_capacity._0_2_ = 0x2d;
  local_70._M_string_length = 1;
  std::operator+(&local_130,"Argument name begin with either \'",&local_70);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_1c8._M_dataplus._M_p = (pointer)*plVar9;
  psVar10 = (size_type *)(plVar9 + 2);
  if ((size_type *)local_1c8._M_dataplus._M_p == psVar10) {
    local_1c8.field_2._M_allocated_capacity = *psVar10;
    local_1c8.field_2._8_8_ = plVar9[3];
    local_1c8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar10;
  }
  local_1c8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
  local_b0._M_string_length = 2;
  local_b0.field_2._M_local_buf[2] = '\0';
  std::operator+(&local_1a8,&local_1c8,&local_b0);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  local_1f0._M_dataplus._M_p = (pointer)*plVar9;
  plVar11 = plVar9 + 2;
  if ((long *)local_1f0._M_dataplus._M_p == plVar11) {
    local_1f0.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar11;
    local_1f0.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar9 + 0x14);
    local_1f0.field_2._8_4_ = (undefined4)plVar9[3];
    local_1f0.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  }
  else {
    local_1f0.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar11;
    local_1f0.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar11 >> 0x20);
  }
  local_1f0._M_string_length = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (*this->_vptr_Arg[7])(&local_90,this);
  SpecificationException::SpecificationException(pSVar8,&local_1f0,&local_90);
  __cxa_throw(pSVar8,&SpecificationException::typeinfo,ArgException::~ArgException);
}

Assistant:

inline Arg::Arg(const std::string& flag,
         const std::string& name,
         const std::string& desc,
         bool req,
         bool valreq,
         Visitor* v) :
  _flag(flag),
  _name(name),
  _description(desc),
  _required(req),
  _requireLabel("required"),
  _valueRequired(valreq),
  _alreadySet(false),
  _visitor( v ),
  _ignoreable(true),
  _xorSet(false),
  _acceptsMultipleValues(false)
{
	if ( _flag.length() > 1 )
		throw(SpecificationException(
				"Argument flag can only be one character long", toString() ) );

	if ( _name != ignoreNameString() &&
		 ( _flag == Arg::flagStartString() ||
		   _flag == Arg::nameStartString() ||
		   _flag == " " ) )
		throw(SpecificationException("Argument flag cannot be either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or a space.",
							toString() ) );

	if ( ( _name.substr( 0, Arg::flagStartString().length() ) == Arg::flagStartString() ) ||
		 ( _name.substr( 0, Arg::nameStartString().length() ) == Arg::nameStartString() ) ||
		 ( _name.find( " ", 0 ) != std::string::npos ) )
		throw(SpecificationException("Argument name begin with either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or space.",
							toString() ) );

}